

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockmodel.cpp
# Opt level: O0

void __thiscall
blockmodel_t::apply_mcmc_moves
          (blockmodel_t *this,vector<mcmc_move_t,_std::allocator<mcmc_move_t>_> *moves)

{
  uint uVar1;
  vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
  *pvVar2;
  bool bVar3;
  ulong uVar4;
  size_type sVar5;
  reference pvVar6;
  reference pvVar7;
  reference puVar8;
  reference pvVar9;
  reference pvVar10;
  reference pvVar11;
  _Self local_30;
  _Self local_28;
  iterator neighbour;
  uint i;
  vector<mcmc_move_t,_std::allocator<mcmc_move_t>_> *moves_local;
  blockmodel_t *this_local;
  
  neighbour._M_node._4_4_ = 0;
  while( true ) {
    uVar4 = (ulong)neighbour._M_node._4_4_;
    sVar5 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::size(moves);
    if (sVar5 <= uVar4) break;
    pvVar2 = this->adj_list_ptr_;
    pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                       (moves,(ulong)neighbour._M_node._4_4_);
    pvVar7 = std::
             vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
             ::at(pvVar2,(ulong)pvVar6->vertex);
    local_28._M_node =
         (_Base_ptr)
         std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::begin
                   (pvVar7);
    while( true ) {
      pvVar2 = this->adj_list_ptr_;
      pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                         (moves,(ulong)neighbour._M_node._4_4_);
      pvVar7 = std::
               vector<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>,_std::allocator<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>
               ::at(pvVar2,(ulong)pvVar6->vertex);
      local_30._M_node =
           (_Base_ptr)
           std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::end
                     (pvVar7);
      bVar3 = std::operator!=(&local_28,&local_30);
      if (!bVar3) break;
      puVar8 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_28);
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->k_,(ulong)*puVar8);
      pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                         (moves,(ulong)neighbour._M_node._4_4_);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(ulong)pvVar6->source);
      *pvVar10 = *pvVar10 + -1;
      puVar8 = std::_Rb_tree_const_iterator<unsigned_int>::operator*(&local_28);
      pvVar9 = std::
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ::operator[](&this->k_,(ulong)*puVar8);
      pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                         (moves,(ulong)neighbour._M_node._4_4_);
      pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](pvVar9,(ulong)pvVar6->target);
      *pvVar10 = *pvVar10 + 1;
      std::_Rb_tree_const_iterator<unsigned_int>::operator++(&local_28);
    }
    pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                       (moves,(ulong)neighbour._M_node._4_4_);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&this->n_,(ulong)pvVar6->source);
    *pvVar10 = *pvVar10 + -1;
    pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                       (moves,(ulong)neighbour._M_node._4_4_);
    pvVar10 = std::vector<int,_std::allocator<int>_>::operator[](&this->n_,(ulong)pvVar6->target);
    *pvVar10 = *pvVar10 + 1;
    pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                       (moves,(ulong)neighbour._M_node._4_4_);
    uVar1 = pvVar6->target;
    pvVar6 = std::vector<mcmc_move_t,_std::allocator<mcmc_move_t>_>::operator[]
                       (moves,(ulong)neighbour._M_node._4_4_);
    pvVar11 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                        (&this->memberships_,(ulong)pvVar6->vertex);
    *pvVar11 = uVar1;
    neighbour._M_node._4_4_ = neighbour._M_node._4_4_ + 1;
  }
  return;
}

Assistant:

void blockmodel_t::apply_mcmc_moves(std::vector<mcmc_move_t> moves)
{
  for (unsigned int i = 0; i < moves.size(); ++i)
  {
        // Change block degrees and block sizes
    for (auto neighbour = adj_list_ptr_->at(moves[i].vertex).begin();
     neighbour != adj_list_ptr_->at(moves[i].vertex).end();
     ++neighbour)
    {
      --k_[*neighbour][moves[i].source];
      ++k_[*neighbour][moves[i].target];
    }
    --n_[moves[i].source];
    ++n_[moves[i].target];
        // Set new memberships
    memberships_[moves[i].vertex] = moves[i].target;
  }
}